

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall
libtorrent::piece_availability_alert::~piece_availability_alert(piece_availability_alert *this)

{
  _Atomic_word *p_Var1;
  pointer piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  piVar2 = (this->piece_availability).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->piece_availability).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_004dc350;
  p_Var3 = (this->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

struct TORRENT_EXPORT piece_availability_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT piece_availability_alert(aux::stack_allocator& alloc, torrent_handle h
			, std::vector<int> pa);
		TORRENT_DEFINE_ALERT_PRIO(piece_availability_alert, 103, alert_priority::critical)

		static constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;

		// info about pieces being downloaded for the torrent
		std::vector<int> piece_availability;
	}